

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

HRESULT __thiscall
Js::SourceTextModuleRecord::ParseSource
          (SourceTextModuleRecord *this,byte *sourceText,uint32 sourceLength,SRCINFO *srcInfo,
          Var *exceptionVar,bool isUtf8)

{
  Type *addr;
  Type *addr_00;
  long lVar1;
  Type *addr_01;
  ScriptContext *scriptContext;
  Var pvVar2;
  void *pvVar3;
  ThreadContext *pTVar4;
  code *pcVar5;
  BSTR pWVar6;
  Var *ppvVar7;
  bool bVar8;
  int iVar9;
  HRESULT HVar10;
  BOOL BVar11;
  Data DVar12;
  undefined4 *puVar13;
  JavascriptString *pJVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Parser *pPVar16;
  ParseNodeProg *pPVar17;
  undefined4 extraout_var_01;
  size_t sVar18;
  Recycler *this_00;
  PCWSTR message;
  WCHAR *sourceUrl;
  JavascriptError *pJVar19;
  undefined4 extraout_var_03;
  void *__frameAddr;
  size_t size;
  undefined1 auStack_e8 [8];
  CompileScriptException se;
  Utf8SourceInfo *pResultSourceInfo;
  AutoNestedHandledExceptionType local_3c;
  Var *ppvStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  char16_t *pcVar15;
  undefined4 extraout_var_02;
  
  ppvStack_38 = exceptionVar;
  if ((sourceText != (byte *)0x0) && (this->wasParsed != false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x52,"(!wasParsed || sourceText == nullptr)",
                                "!wasParsed || sourceText == nullptr");
    if (!bVar8) goto LAB_00b11d85;
    *puVar13 = 0;
  }
  if (this->parser != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x53,"(parser == nullptr)","parser == nullptr");
    if (!bVar8) goto LAB_00b11d85;
    *puVar13 = 0;
  }
  if (ppvStack_38 == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x54,"(exceptionVar != nullptr)","exceptionVar != nullptr");
    if (!bVar8) goto LAB_00b11d85;
    *puVar13 = 0;
  }
  ppvVar7 = ppvStack_38;
  if ((sourceText == (byte *)0x0) && (this->wasParsed != false)) {
    return 0;
  }
  scriptContext = (this->scriptContext).ptr;
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  auStack_e8._0_4_ = 0;
  auStack_e8._4_4_ = 0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  *ppvStack_38 = (Var)0x0;
  if (((scriptContext->config).threadConfig)->m_ES6Module == false) {
    pJVar19 = JavascriptLibrary::CreateError
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessageProperties(pJVar19,0,L"ES6Module not supported",scriptContext);
    *ppvVar7 = pJVar19;
    HVar10 = -0x7fffbfff;
  }
  else {
    if ((this->promise).ptr == (JavascriptPromise *)0x0 &&
        (this->parentModuleList).ptr ==
        (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      this->isRootModule = true;
    }
    if (sourceText == (byte *)0x0) {
      if (sourceLength != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x73,"(sourceLength == 0)","sourceLength == 0");
        if (!bVar8) goto LAB_00b11d85;
        *puVar13 = 0;
      }
      pvVar2 = (this->normalizedSpecifier).ptr;
      if (pvVar2 == (Var)0x0) {
        pcVar15 = L"module";
      }
      else {
        pJVar14 = VarTo<Js::JavascriptString>(pvVar2);
        iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
        pcVar15 = (char16_t *)CONCAT44(extraout_var_00,iVar9);
      }
      Output::TraceWithFlush(ModulePhase,L"Failed to load: %s\n",pcVar15);
      pvVar2 = (this->normalizedSpecifier).ptr;
      if (pvVar2 == (Var)0x0) {
        pcVar15 = L"module";
      }
      else {
        pJVar14 = VarTo<Js::JavascriptString>(pvVar2);
        iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
        pcVar15 = (char16_t *)CONCAT44(extraout_var_01,iVar9);
      }
      sVar18 = PAL_wcslen(pcVar15);
      lVar1 = sVar18 + 1;
      se.bstrLine = L"\xe648ŕ";
      this_00 = Memory::Recycler::TrackAllocInfo
                          (scriptContext->recycler,(TrackAllocData *)&se.bstrLine);
      if (lVar1 == 0) {
        message = (PCWSTR)&DAT_00000008;
        Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      }
      else {
        size = 0xffffffffffffffff;
        if (-1 < lVar1) {
          size = lVar1 * 2;
        }
        BVar11 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar11 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar8) goto LAB_00b11d85;
          *puVar13 = 0;
        }
        if (size == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                      "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
          if (!bVar8) goto LAB_00b11d85;
          *puVar13 = 0;
        }
        message = (PCWSTR)Memory::Recycler::
                          AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(this_00,size)
        ;
        if (message == (PCWSTR)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar8) {
LAB_00b11d85:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar13 = 0;
        }
      }
      memcpy_s(message,lVar1 * 2,pcVar15,sVar18 * 2);
      message[sVar18] = L'\0';
      pJVar19 = JavascriptLibrary::CreateURIError
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      HVar10 = -0x7fffbffb;
      JavascriptError::SetErrorMessageProperties(pJVar19,-0x7fffbffb,message,scriptContext);
      *ppvStack_38 = pJVar19;
    }
    else {
      pvVar2 = (this->normalizedSpecifier).ptr;
      if (pvVar2 == (Var)0x0) {
        pcVar15 = L"module";
      }
      else {
        pJVar14 = VarTo<Js::JavascriptString>(pvVar2);
        iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
        pcVar15 = (char16_t *)CONCAT44(extraout_var,iVar9);
      }
      Output::TraceWithFlush(ModulePhase,L"ParseSource(%s)\n",pcVar15);
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (&local_3c,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      pPVar16 = (Parser *)
                new<Memory::ArenaAllocator>(0xaa8,&scriptContext->generalAllocator,0x366bee);
      Parser::Parser(pPVar16,scriptContext,0,(PageAllocator *)0x0,false,0xaa8);
      this->parser = pPVar16;
      srcInfo->moduleID = this->moduleId;
      se.bstrLine = (BSTR)0x0;
      pPVar17 = ScriptContext::ParseScript
                          (scriptContext,pPVar16,sourceText,(ulong)sourceLength,srcInfo,
                           (CompileScriptException *)auStack_e8,(Utf8SourceInfo **)&se.bstrLine,
                           L"Module code",
                           (uint)isUtf8 << 6 |
                           (LoadScriptFlag_Module|LoadScriptFlag_disableAsmJs|
                           LoadScriptFlag_Expression),&this->sourceIndex,(Var)0x0);
      addr = &this->parseTree;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pPVar17;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pWVar6 = se.bstrLine;
      addr_00 = &this->pSourceInfo;
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = (Utf8SourceInfo *)pWVar6;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
      if ((this->parseTree).ptr == (ParseNodeProg *)0x0) {
        HVar10 = -0x7fffbffb;
      }
      else {
        HVar10 = PostParseProcess(this);
        if (HVar10 == 0) {
          pvVar3 = (this->errorObject).ptr;
          HVar10 = 0;
          if ((pvVar3 != (void *)0x0) && (HVar10 = 0, this->hadNotifyHostReady == true)) {
            if (*ppvStack_38 == (Var)0x0) {
              *ppvStack_38 = pvVar3;
            }
            HVar10 = -0x7fffbffb;
            ReleaseParserResourcesForHierarchy(this);
            goto LAB_00b11d64;
          }
        }
      }
    }
    if (HVar10 < 0) {
      if (*ppvStack_38 == (Var)0x0) {
        pvVar2 = (this->normalizedSpecifier).ptr;
        if (pvVar2 == (Var)0x0) {
          sourceUrl = L"module";
        }
        else {
          pJVar14 = VarTo<Js::JavascriptString>(pvVar2);
          iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
          sourceUrl = (WCHAR *)CONCAT44(extraout_var_02,iVar9);
        }
        pJVar19 = JavascriptError::CreateFromCompileScriptException
                            (scriptContext,(CompileScriptException *)auStack_e8,sourceUrl);
        *ppvStack_38 = pJVar19;
      }
      ReleaseParserResourcesForHierarchy(this);
      pPVar16 = this->parser;
      if (pPVar16 != (Parser *)0x0) {
        (this->parseTree).ptr = (ParseNodeProg *)0x0;
        Parser::~Parser(pPVar16);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (&(scriptContext->generalAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,pPVar16
                   ,0xaa8);
        this->parser = (Type)0x0;
      }
      if ((this->errorObject).ptr == (void *)0x0) {
        addr_01 = &this->errorObject;
        pvVar3 = *ppvStack_38;
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pvVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
      }
      if ((this->promise).ptr != (JavascriptPromise *)0x0) {
        ResolveOrRejectDynamicImportPromise
                  (false,(this->errorObject).ptr,(this->scriptContext).ptr,this,false);
      }
      if ((this->isRootModule == true) && (this->hadNotifyHostReady == false)) {
        pvVar2 = (this->normalizedSpecifier).ptr;
        if (pvVar2 == (Var)0x0) {
          pcVar15 = L"module";
        }
        else {
          pJVar14 = VarTo<Js::JavascriptString>(pvVar2);
          iVar9 = (*(pJVar14->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar14);
          pcVar15 = (char16_t *)CONCAT44(extraout_var_03,iVar9);
        }
        Output::TraceWithFlush
                  (ModulePhase,L"\t>NotifyHostAboutModuleReady %s (ParseSource error)\n",pcVar15);
        if (scriptContext->threadContext->isScriptActive == true) {
          LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)&se.bstrLine,scriptContext,
                     &stack0xfffffffffffffff8);
          pTVar4 = scriptContext->threadContext;
          bVar8 = pTVar4->reentrancySafeOrHandled;
          pTVar4->reentrancySafeOrHandled = true;
          (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                    (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
          pTVar4->reentrancySafeOrHandled = bVar8;
          LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)&se.bstrLine);
        }
        else {
          DVar12 = ExceptionCheck::Save();
          se.bstrLine = (BSTR)CONCAT44(se.bstrLine._4_4_,DVar12.handledExceptionType);
          (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                    (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ExceptionCheck::Restore((Data *)&se.bstrLine);
        }
        this->hadNotifyHostReady = true;
      }
      Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentAsNeeded\n");
      NotifyParentsAsNeeded(this);
    }
  }
LAB_00b11d64:
  CompileScriptException::~CompileScriptException((CompileScriptException *)auStack_e8);
  return HVar10;
}

Assistant:

HRESULT SourceTextModuleRecord::ParseSource(__in_bcount(sourceLength) byte* sourceText, uint32 sourceLength, SRCINFO * srcInfo, Var* exceptionVar, bool isUtf8)
    {
        Assert(!wasParsed || sourceText == nullptr);
        Assert(parser == nullptr);
        Assert(exceptionVar != nullptr);
        HRESULT hr = NOERROR;

        // Return if loading failure has been reported
        if (sourceText == nullptr && wasParsed)
        {
            return hr;
        }

        ScriptContext* scriptContext = GetScriptContext();
        CompileScriptException se;
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        *exceptionVar = nullptr;
        if (!scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            JavascriptError *pError = scriptContext->GetLibrary()->CreateError();
            JavascriptError::SetErrorMessageProperties(pError, hr, _u("ES6Module not supported"), scriptContext);
            *exceptionVar = pError;
            return E_NOTIMPL;
        }

        // Mark module as root module if it currently has no parents
        // Note, if there are circular imports it may gain parents later
        if (parentModuleList == nullptr && promise == nullptr)
        {
            SetIsRootModule();
        }

        // Host indicates that the current module failed to load.
        if (sourceText == nullptr)
        {
            Assert(sourceLength == 0);
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("Failed to load: %s\n"), this->GetSpecifierSz());
            hr = E_FAIL;

            // We cannot just use the buffer in the specifier string - need to make a copy here.
            const char16* moduleName = this->GetSpecifierSz();
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            JavascriptError *pError = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(pError, hr, allocatedString, scriptContext);
            *exceptionVar = pError;
        }
        else
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ParseSource(%s)\n"), this->GetSpecifierSz());
            try
            {
                AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
                this->parser = Anew(allocator, Parser, scriptContext);
                srcInfo->moduleID = moduleId;

                LoadScriptFlag loadScriptFlag = (LoadScriptFlag)(LoadScriptFlag_Expression | LoadScriptFlag_Module |
                    LoadScriptFlag_disableAsmJs | (isUtf8 ? LoadScriptFlag_Utf8Source : LoadScriptFlag_None));

                Utf8SourceInfo* pResultSourceInfo = nullptr;
                this->parseTree = scriptContext->ParseScript(parser, sourceText,
                    sourceLength, srcInfo, &se, &pResultSourceInfo, Constants::ModuleCode,
                    loadScriptFlag, &sourceIndex, nullptr);
                this->pSourceInfo = pResultSourceInfo;
            }
            catch (Js::OutOfMemoryException)
            {
                hr = E_OUTOFMEMORY;
            }
            catch (Js::StackOverflowException)
            {
                hr = VBSERR_OutOfStack;
            }

            if (FAILED(hr))
            {
                se.ProcessError(nullptr, hr, nullptr);
            }
            else if (parseTree == nullptr)
            {
                hr = E_FAIL;
            }
            else
            {
                hr = PostParseProcess();
                if (hr == S_OK && this->errorObject != nullptr && this->hadNotifyHostReady)
                {
                    // This would be the case where the child module got error and current module has notified error already.
                    if (*exceptionVar == nullptr)
                    {
                        *exceptionVar = this->errorObject;
                    }

                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    return E_FAIL;
                }
            }
        }

        if (FAILED(hr))
        {
            if (*exceptionVar == nullptr)
            {
                const WCHAR * sourceUrl = this->GetSpecifierSz();

                *exceptionVar = JavascriptError::CreateFromCompileScriptException(scriptContext, &se, sourceUrl);
            }
            // Cleanup in case of error.
            this->ReleaseParserResourcesForHierarchy();
            if (this->parser)
            {
                this->parseTree = nullptr;
                Adelete(allocator, this->parser);
                this->parser = nullptr;
            }
            if (this->errorObject == nullptr)
            {
                this->errorObject = *exceptionVar;
            }

            if (this->promise != nullptr)
            {
                SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, this->scriptContext, this, false);
            }

            // Notify host if current module is root module and the host hasn't been notified
            if (isRootModule && !hadNotifyHostReady)
            {
                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (ParseSource error)\n"), this->GetSpecifierSz());
                LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                {
                    scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                });

                hadNotifyHostReady = true;
            }

            // Notify parent if applicable
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentAsNeeded\n"));
            NotifyParentsAsNeeded();
        }
        return hr;
    }